

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiTextBuffer::appendv(ImGuiTextBuffer *this,char *fmt,__va_list_tag *args)

{
  int new_size;
  int i;
  int iVar1;
  int iVar2;
  value_type_conflict3 *pvVar3;
  va_list args_copy;
  __va_list_tag local_48;
  
  local_48.reg_save_area = args->reg_save_area;
  local_48.gp_offset = args->gp_offset;
  local_48.fp_offset = args->fp_offset;
  local_48.overflow_arg_area = args->overflow_arg_area;
  iVar2 = vsnprintf((char *)0x0,0,fmt,args);
  if (0 < iVar2) {
    i = (this->Buf).Size;
    iVar1 = (this->Buf).Capacity;
    new_size = i + iVar2;
    if (iVar1 <= new_size) {
      iVar1 = iVar1 * 2;
      if (iVar1 < new_size) {
        iVar1 = new_size;
      }
      ImVector<char>::reserve(&this->Buf,iVar1);
    }
    ImVector<char>::resize(&this->Buf,new_size);
    pvVar3 = ImVector<char>::operator[](&this->Buf,i);
    ImFormatStringV(pvVar3 + -1,iVar2 + 1,fmt,&local_48);
  }
  return;
}

Assistant:

void ImGuiTextBuffer::appendv(const char* fmt, va_list args)
{
    va_list args_copy;
    va_copy(args_copy, args);

    int len = vsnprintf(NULL, 0, fmt, args);         // FIXME-OPT: could do a first pass write attempt, likely successful on first pass.
    if (len <= 0)
        return;

    const int write_off = Buf.Size;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int double_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > double_capacity ? needed_sz : double_capacity);
    }

    Buf.resize(needed_sz);
    ImFormatStringV(&Buf[write_off] - 1, len+1, fmt, args_copy);
}